

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression
          (string *__return_storage_ptr__,Generator *this,Descriptor *containing_type,
          FieldDescriptor *field,string *python_dict_name)

{
  FileDescriptor *pFVar1;
  LogMessage *pLVar2;
  string *psVar3;
  SubstituteArg *arg9;
  SubstituteArg local_280;
  SubstituteArg local_250;
  SubstituteArg local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  SubstituteArg local_190;
  SubstituteArg local_160;
  SubstituteArg local_130;
  SubstituteArg local_100;
  string local_d0;
  SubstituteArg local_b0;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  string *local_30;
  string *python_dict_name_local;
  FieldDescriptor *field_local;
  Descriptor *containing_type_local;
  Generator *this_local;
  
  local_30 = python_dict_name;
  python_dict_name_local = (string *)field;
  field_local = (FieldDescriptor *)containing_type;
  containing_type_local = (Descriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  pFVar1 = FieldDescriptor::file(field);
  local_69 = 0;
  if (pFVar1 != this->file_) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x2f8);
    local_69 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (field.file()) == (file_): ")
    ;
    pFVar1 = FieldDescriptor::file((FieldDescriptor *)python_dict_name_local);
    psVar3 = FileDescriptor::name_abi_cxx11_(pFVar1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," vs. ");
    psVar3 = FileDescriptor::name_abi_cxx11_(this->file_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,psVar3);
    internal::LogFinisher::operator=(local_7d,pLVar2);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (field_local == (FieldDescriptor *)0x0) {
    psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)python_dict_name_local);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_d0,this,(Descriptor *)field_local);
    strings::internal::SubstituteArg::SubstituteArg(&local_b0,&local_d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_100,local_30);
    arg9 = (SubstituteArg *)
           FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)python_dict_name_local);
    strings::internal::SubstituteArg::SubstituteArg(&local_130,(string *)arg9);
    strings::internal::SubstituteArg::SubstituteArg(&local_160);
    strings::internal::SubstituteArg::SubstituteArg(&local_190);
    strings::internal::SubstituteArg::SubstituteArg(&local_1c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_220);
    strings::internal::SubstituteArg::SubstituteArg(&local_250);
    strings::internal::SubstituteArg::SubstituteArg(&local_280);
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"$0.$1[\'$2\']",(char *)&local_b0,&local_100,
               &local_130,&local_160,&local_190,&local_1c0,&local_1f0,&local_220,&local_250,
               &local_280,arg9);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::FieldReferencingExpression(
    const Descriptor* containing_type,
    const FieldDescriptor& field,
    const string& python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  GOOGLE_CHECK_EQ(field.file(), file_) << field.file()->name() << " vs. "
                                << file_->name();
  if (!containing_type) {
    return field.name();
  }
  return strings::Substitute(
      "$0.$1['$2']",
      ModuleLevelDescriptorName(*containing_type),
      python_dict_name, field.name());
}